

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_names.c
# Opt level: O0

int dwarf_get_ATCF_name(uint val,char **s_out)

{
  char **s_out_local;
  uint val_local;
  
  if (val == 0x40) {
    *s_out = "DW_ATCF_lo_user";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x41) {
    *s_out = "DW_ATCF_SUN_mop_bitfield";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x42) {
    *s_out = "DW_ATCF_SUN_mop_spill";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x43) {
    *s_out = "DW_ATCF_SUN_mop_scopy";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x44) {
    *s_out = "DW_ATCF_SUN_func_start";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x45) {
    *s_out = "DW_ATCF_SUN_end_ctors";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x46) {
    *s_out = "DW_ATCF_SUN_branch_target";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x47) {
    *s_out = "DW_ATCF_SUN_mop_stack_probe";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0x48) {
    *s_out = "DW_ATCF_SUN_func_epilog";
    s_out_local._4_4_ = 0;
  }
  else if (val == 0xff) {
    *s_out = "DW_ATCF_hi_user";
    s_out_local._4_4_ = 0;
  }
  else {
    s_out_local._4_4_ = -1;
  }
  return s_out_local._4_4_;
}

Assistant:

int
dwarf_get_ATCF_name (unsigned int val,
    const char ** s_out)
{
    switch (val) {
    case DW_ATCF_lo_user:
        *s_out = "DW_ATCF_lo_user";
        return DW_DLV_OK;
    case DW_ATCF_SUN_mop_bitfield:
        *s_out = "DW_ATCF_SUN_mop_bitfield";
        return DW_DLV_OK;
    case DW_ATCF_SUN_mop_spill:
        *s_out = "DW_ATCF_SUN_mop_spill";
        return DW_DLV_OK;
    case DW_ATCF_SUN_mop_scopy:
        *s_out = "DW_ATCF_SUN_mop_scopy";
        return DW_DLV_OK;
    case DW_ATCF_SUN_func_start:
        *s_out = "DW_ATCF_SUN_func_start";
        return DW_DLV_OK;
    case DW_ATCF_SUN_end_ctors:
        *s_out = "DW_ATCF_SUN_end_ctors";
        return DW_DLV_OK;
    case DW_ATCF_SUN_branch_target:
        *s_out = "DW_ATCF_SUN_branch_target";
        return DW_DLV_OK;
    case DW_ATCF_SUN_mop_stack_probe:
        *s_out = "DW_ATCF_SUN_mop_stack_probe";
        return DW_DLV_OK;
    case DW_ATCF_SUN_func_epilog:
        *s_out = "DW_ATCF_SUN_func_epilog";
        return DW_DLV_OK;
    case DW_ATCF_hi_user:
        *s_out = "DW_ATCF_hi_user";
        return DW_DLV_OK;
    default: break;
    }
    return DW_DLV_NO_ENTRY;
}